

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mojoshader-compiler.c
# Opt level: O1

void print_unroll_attr(FILE *io,int unroll)

{
  size_t __size;
  char *__ptr;
  
  if (unroll == -2) {
    return;
  }
  if (unroll == -1) {
    __ptr = "[unroll] ";
    __size = 9;
  }
  else {
    if (unroll != 0) {
      if (0 < unroll) {
        fprintf((FILE *)io,"[unroll(%d)] ");
        return;
      }
      __assert_fail("unroll > 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/andburn[P]mojoshader/utils/mojoshader-compiler.c"
                    ,0x49,"void print_unroll_attr(FILE *, const int)");
    }
    __ptr = "[loop] ";
    __size = 7;
  }
  fwrite(__ptr,__size,1,(FILE *)io);
  return;
}

Assistant:

static void print_unroll_attr(FILE *io, const int unroll)
{
    // -1 means "unroll at compiler's discretion",
    // -2 means user didn't specify the attribute.
    switch (unroll)
    {
        case 0:
            fprintf(io, "[loop] ");
            break;
        case -1:
            fprintf(io, "[unroll] ");
            break;
        case -2:
            /* no-op. */
            break;
        default:
            assert(unroll > 0);
            fprintf(io, "[unroll(%d)] ", unroll);
            break;
    } // case
}